

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall
CTcTokenizer::parse_macro_actuals
          (CTcTokenizer *this,CTcTokString *srcbuf,utf8_ptr *src,CTcHashEntryPp *entry,
          size_t *argofs,size_t *arglen,int read_more,int *found_actuals)

{
  int iVar1;
  uint uVar2;
  wchar_t wVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  CTcHashEntryPp *in_RCX;
  CTcTokString *in_RSI;
  long in_R8;
  long in_R9;
  bool bVar9;
  int in_stack_00000008;
  undefined4 *in_stack_00000010;
  wchar_t ch_1;
  int sp_cnt_1;
  size_t del_len;
  utf8_ptr p_1;
  char *end;
  char *start;
  wchar_t ch;
  int sp_cnt;
  int brace_depth;
  int bracket_depth;
  int paren_depth;
  utf8_ptr p;
  int i;
  int spliced;
  int argc;
  CTcToken tok;
  tc_toktyp_t typ;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  CTcToken *in_stack_fffffffffffffed0;
  utf8_ptr *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef8;
  CTcTokenizer *in_stack_ffffffffffffff00;
  int local_bc;
  utf8_ptr local_b0;
  char *local_a8;
  char *local_a0;
  wchar_t local_94;
  int local_90;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  utf8_ptr in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar10;
  int iVar11;
  int iVar12;
  tc_toktyp_t local_3c;
  
  CTcToken::CTcToken((CTcToken *)&stack0xffffffffffffff98);
  iVar11 = 0;
  iVar12 = 0;
  local_3c = next_on_line((CTcTokString *)0x0,
                          (utf8_ptr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          (CTcToken *)in_stack_ffffffffffffff80.p_,
                          (tok_embed_ctx *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff74);
  if ((local_3c == TOKT_EOF) && (in_stack_00000008 != 0)) {
    local_3c = actual_splice_next_line
                         ((CTcTokenizer *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          (CTcTokString *)
                          CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    iVar11 = 1;
  }
  if (local_3c != TOKT_LPAR) {
    *in_stack_00000010 = 0;
    if (iVar11 != 0) {
      CTcToken::get_text((CTcToken *)&stack0xffffffffffffff98);
      unsplice_line(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    return 0;
  }
  pcVar5 = CTcToken::get_text((CTcToken *)&stack0xffffffffffffff98);
  sVar6 = CTcToken::get_text_len((CTcToken *)&stack0xffffffffffffff98);
  pcVar7 = CTcTokString::get_text(in_RSI);
  *(char **)(in_R8 + (long)iVar12 * 8) = pcVar5 + (sVar6 - (long)pcVar7);
  local_3c = next_on_line((CTcTokString *)CONCAT44(iVar12,iVar11),
                          (utf8_ptr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          (CTcToken *)in_stack_ffffffffffffff80.p_,
                          (tok_embed_ctx *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff74);
LAB_00297f6d:
  do {
    if (local_3c == TOKT_RPAR) goto LAB_00298409;
    utf8_ptr::utf8_ptr((utf8_ptr *)&stack0xffffffffffffff80);
    iVar10 = iVar12;
    iVar1 = CTcHashEntryPp::get_argc(in_RCX);
    bVar9 = iVar1 <= iVar12;
    iVar12 = iVar10;
    if (((bVar9) && (iVar1 = CTcHashEntryPp::has_varargs(in_RCX), iVar12 = iVar10, iVar1 == 0)) ||
       (0x7f < iVar12)) {
      sVar6 = CVmHashEntry::getlen((CVmHashEntry *)in_RCX);
      pcVar5 = CVmHashEntry::getstr((CVmHashEntry *)in_RCX);
      log_error(0x2731,sVar6 & 0xffffffff,pcVar5);
      while (local_3c != TOKT_RPAR && local_3c != TOKT_EOF) {
        local_3c = next_on_line((CTcTokString *)CONCAT44(iVar12,iVar11),
                                (utf8_ptr *)
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                (CTcToken *)in_stack_ffffffffffffff80.p_,
                                (tok_embed_ctx *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                in_stack_ffffffffffffff74);
      }
LAB_00298409:
      if (local_3c != TOKT_RPAR) {
        uVar4 = 0x272d;
        if (in_stack_00000008 != 0) {
          uVar4 = 0x2730;
        }
        sVar6 = CVmHashEntry::getlen((CVmHashEntry *)in_RCX);
        uVar2 = (uint)sVar6;
        pcVar5 = CVmHashEntry::getstr((CVmHashEntry *)in_RCX);
        log_error((int)(ulong)uVar4,(ulong)uVar2,pcVar5);
        return 1;
      }
      iVar10 = 0;
      do {
        if (iVar12 <= iVar10) {
          if (iVar11 != 0) {
            CTcToken::get_text((CTcToken *)&stack0xffffffffffffff98);
            CTcToken::get_text_len((CTcToken *)&stack0xffffffffffffff98);
            unsplice_line(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          }
          iVar11 = iVar12;
          iVar1 = CTcHashEntryPp::get_min_argc(in_RCX);
          iVar10 = iVar11;
          if (iVar12 < iVar1) {
            while (iVar11 = iVar10, iVar12 = CTcHashEntryPp::get_argc(in_RCX), iVar10 < iVar12) {
              *(undefined8 *)(in_R8 + (long)iVar11 * 8) = 0;
              *(undefined8 *)(in_R9 + (long)iVar11 * 8) = 0;
              iVar10 = iVar11 + 1;
            }
            sVar6 = CVmHashEntry::getlen((CVmHashEntry *)in_RCX);
            uVar4 = (uint)sVar6;
            pcVar5 = CVmHashEntry::getstr((CVmHashEntry *)in_RCX);
            log_warning(0x272f,(ulong)uVar4,pcVar5);
          }
          iVar12 = CTcHashEntryPp::has_varargs(in_RCX);
          if ((iVar12 != 0) && (iVar11 < 0x80)) {
            *(undefined8 *)(in_R8 + (long)iVar11 * 8) = 0;
            *(undefined8 *)(in_R9 + (long)iVar11 * 8) = 0;
          }
          *in_stack_00000010 = 1;
          return 0;
        }
        utf8_ptr::utf8_ptr(&local_b0);
        local_a0 = CTcTokString::get_text(in_RSI);
        local_a0 = local_a0 + *(long *)(in_R8 + (long)iVar10 * 8);
        local_a8 = local_a0 + *(long *)(in_R9 + (long)iVar10 * 8);
        utf8_ptr::set(&local_b0,local_a0);
        while( true ) {
          pcVar5 = utf8_ptr::getptr(&local_b0);
          bVar9 = false;
          if (pcVar5 < local_a8) {
            utf8_ptr::getch((utf8_ptr *)0x298529);
            iVar1 = is_space(L'\0');
            bVar9 = iVar1 != 0;
          }
          if (!bVar9) break;
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        }
        pcVar5 = utf8_ptr::getptr(&local_b0);
        lVar8 = (long)pcVar5 - (long)local_a0;
        *(long *)(in_R8 + (long)iVar10 * 8) = lVar8 + *(long *)(in_R8 + (long)iVar10 * 8);
        *(long *)(in_R9 + (long)iVar10 * 8) = *(long *)(in_R9 + (long)iVar10 * 8) - lVar8;
        local_a0 = local_a0 + lVar8;
        utf8_ptr::set(&local_b0,local_a8);
        local_bc = 0;
        while (pcVar5 = utf8_ptr::getptr(&local_b0), local_a0 < pcVar5) {
          utf8_ptr::dec((utf8_ptr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          wVar3 = utf8_ptr::getch((utf8_ptr *)0x298621);
          iVar1 = is_space(L'\0');
          if (iVar1 == 0) {
            utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
            ;
            if ((wVar3 == L'\\') && (local_bc != 0)) {
              utf8_ptr::inc((utf8_ptr *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            }
            break;
          }
          local_bc = local_bc + 1;
        }
        pcVar5 = local_a8;
        pcVar7 = utf8_ptr::getptr(&local_b0);
        *(long *)(in_R9 + (long)iVar10 * 8) =
             *(long *)(in_R9 + (long)iVar10 * 8) - ((long)pcVar5 - (long)pcVar7);
        iVar10 = iVar10 + 1;
      } while( true );
    }
    in_stack_ffffffffffffff74 = 0;
    in_stack_ffffffffffffff78 = 0;
    in_stack_ffffffffffffff7c = 0;
    do {
      if ((((local_3c == TOKT_COMMA) && (in_stack_ffffffffffffff7c == 0)) &&
          ((in_stack_ffffffffffffff74 == 0 && (in_stack_ffffffffffffff78 == 0)))) ||
         ((local_3c == TOKT_RPAR && (in_stack_ffffffffffffff7c == 0)))) break;
      switch(local_3c) {
      case TOKT_LPAR:
        in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1;
        break;
      case TOKT_RPAR:
        in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + -1;
        break;
      default:
        break;
      case TOKT_LBRACE:
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1;
        break;
      case TOKT_RBRACE:
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + -1;
        break;
      case TOKT_LBRACK:
        in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 1;
        break;
      case TOKT_RBRACK:
        in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + -1;
      }
      local_3c = next_on_line((CTcTokString *)CONCAT44(iVar12,iVar11),
                              (utf8_ptr *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                              (CTcToken *)in_stack_ffffffffffffff80.p_,
                              (tok_embed_ctx *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              in_stack_ffffffffffffff74);
      if ((local_3c == TOKT_EOF) && (in_stack_00000008 != 0)) {
        local_3c = actual_splice_next_line
                             ((CTcTokenizer *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                              (CTcTokString *)
                              CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                              in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        iVar11 = 1;
      }
    } while (local_3c != TOKT_EOF);
    if (local_3c == TOKT_EOF) goto LAB_00298409;
    local_90 = 0;
    pcVar5 = CTcToken::get_text((CTcToken *)&stack0xffffffffffffff98);
    utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffff80,pcVar5);
    while( true ) {
      pcVar5 = utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffff80);
      pcVar7 = CTcTokString::get_text(in_RSI);
      if (pcVar5 <= pcVar7 + *(long *)(in_R8 + (long)iVar12 * 8)) break;
      utf8_ptr::dec((utf8_ptr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      local_94 = utf8_ptr::getch((utf8_ptr *)0x298297);
      iVar10 = is_space(L'\0');
      if (iVar10 == 0) {
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        if ((local_94 == L'\\') && (local_90 != 0)) {
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        }
        break;
      }
      local_90 = local_90 + 1;
    }
    in_stack_ffffffffffffff00 =
         (CTcTokenizer *)utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffff80);
    pcVar5 = CTcTokString::get_text(in_RSI);
    *(char **)(in_R9 + (long)iVar12 * 8) =
         (char *)((long)in_stack_ffffffffffffff00 +
                 (-*(long *)(in_R8 + (long)iVar12 * 8) - (long)pcVar5));
    iVar12 = iVar12 + 1;
    if (local_3c == TOKT_COMMA) {
      in_stack_fffffffffffffef8 = CTcToken::get_text((CTcToken *)&stack0xffffffffffffff98);
      sVar6 = CTcToken::get_text_len((CTcToken *)&stack0xffffffffffffff98);
      in_stack_fffffffffffffef8 = in_stack_fffffffffffffef8 + sVar6;
      pcVar5 = CTcTokString::get_text(in_RSI);
      *(long *)(in_R8 + (long)iVar12 * 8) = (long)in_stack_fffffffffffffef8 - (long)pcVar5;
      local_3c = next_on_line((CTcTokString *)CONCAT44(iVar12,iVar11),
                              (utf8_ptr *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                              (CTcToken *)in_stack_ffffffffffffff80.p_,
                              (tok_embed_ctx *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              in_stack_ffffffffffffff74);
      goto LAB_00297f6d;
    }
    if (local_3c == TOKT_RPAR) goto LAB_00298409;
  } while( true );
}

Assistant:

int CTcTokenizer::parse_macro_actuals(const CTcTokString *srcbuf,
                                      utf8_ptr *src,
                                      const CTcHashEntryPp *entry,
                                      size_t argofs[TOK_MAX_MACRO_ARGS],
                                      size_t arglen[TOK_MAX_MACRO_ARGS],
                                      int read_more, int *found_actuals)
{
    tc_toktyp_t typ;
    CTcToken tok;
    int argc;
    int spliced;
    int i;

    /* presume we're not going to do any line splicing */
    spliced = FALSE;

    /* no arguments parsed yet */
    argc = 0;

    /* get the next token after the macro symbol */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* splice another line if necessary */
    if (typ == TOKT_EOF && read_more)
    {
        /* splice a line */
        typ = actual_splice_next_line(srcbuf, src, &tok);

        /* note the splice */
        spliced = TRUE;
    }

    /* if we didn't find an open paren, there's no actual list after all */
    if (typ != TOKT_LPAR)
    {
        /* tell the caller we didn't find any actuals */
        *found_actuals = FALSE;

        /* if we spliced a line, unsplice it at the current token */
        if (spliced)
            unsplice_line(tok.get_text());

        /* return success */
        return 0;
    }

    /* remember the offset of the start of the first argument */
    argofs[argc] = tok.get_text() + tok.get_text_len() - srcbuf->get_text();

    /* skip the open paren */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* read the arguments */
    while (typ != TOKT_RPAR)
    {
        utf8_ptr p;
        int paren_depth, bracket_depth, brace_depth;
        int sp_cnt;

        /* if we have too many arguments, it's an error */
        if ((argc >= entry->get_argc() && !entry->has_varargs())
            || argc >= TOK_MAX_MACRO_ARGS)
        {
            /* log the error */
            log_error(TCERR_PP_MANY_MACRO_ARGS,
                      (int)entry->getlen(), entry->getstr());

            /* scan ahead to to close paren or end of line */
            while (typ != TOKT_RPAR && typ != TOKT_EOF)
                typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                                   TRUE);
            
            /* done scanning arguments */
            break;
        }
        
        /* 
         *   Skip tokens until we find the end of the argument.  An argument
         *   ends at:
         *   
         *   - a comma outside of nested parens, square brackets, or curly
         *   braces
         *   
         *   - a close paren that doesn't match an open paren found earlier
         *   in the same argument
         */
        paren_depth = bracket_depth = brace_depth = 0;
        for (;;)
        {
            /* 
             *   If it's a comma, and we're not in any sort of nested
             *   brackets (parens, square brackets, or curly braces), the
             *   comma ends the argument.  A comma within any type of
             *   brackets is part of the argument text.
             */
            if (typ == TOKT_COMMA
                && paren_depth == 0 && brace_depth == 0 && bracket_depth == 0)
                break;

            /*
             *   If it's a close paren, and it doesn't match an earlier open
             *   paren in the same argument, it's the end of the argument. 
             */
            if (typ == TOKT_RPAR && paren_depth == 0)
                break;

            /* 
             *   if it's an open or close paren, brace, or bracket, adjust
             *   the depth accordingly 
             */
            switch(typ)
            {
            case TOKT_LPAR:
                ++paren_depth;
                break;

            case TOKT_RPAR:
                --paren_depth;
                break;

            case TOKT_LBRACE:
                ++brace_depth;
                break;

            case TOKT_RBRACE:
                --brace_depth;
                break;

            case TOKT_LBRACK:
                ++bracket_depth;
                break;

            case TOKT_RBRACK:
                --bracket_depth;
                break;

            default:
                break;
            }
            
            /* get the next token */
            typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                               TRUE);
            
            /* 
             *   if we're at the end of the line, and we're allowed to
             *   read more, splice the next line onto the current line 
             */
            if (typ == TOKT_EOF && read_more)
            {
                /* splice a line */
                typ = actual_splice_next_line(srcbuf, src, &tok);

                /* note that we've done some line splicing */
                spliced = TRUE;
            }
            
            /* if we've reached the end of the file, stop */
            if (typ == TOKT_EOF)
                break;
        }

        /* if we've reached the end of the file, stop */
        if (typ == TOKT_EOF)
            break;

        /* remove any trailing whitespace from the actual's text */
        sp_cnt = 0;
        p.set((char *)tok.get_text());
        while (p.getptr() > srcbuf->get_text() + argofs[argc])
        {
            wchar_t ch;

            /* move to the prior character */
            p.dec();

            /* if it's not a space, stop looking */
            ch = p.getch();
            if (!is_space(ch))
            {
                /* 
                 *   advance past this character so that we keep it in the
                 *   expansion 
                 */
                p.inc();

                /* 
                 *   if this last character was a backslash, and we removed
                 *   at least one space following it, keep the one space
                 *   that immediately follows the backslash, since that
                 *   space is part of the backslash's two-character escape
                 *   sequence 
                 */
                if (ch == '\\' && sp_cnt != 0)
                    p.inc();

                /* stop scanning */
                break;
            }

            /* that's one more trailing space we've removed - count it */
            ++sp_cnt;
        }

        /* note the argument length */
        arglen[argc] = (p.getptr() - srcbuf->get_text()) - argofs[argc];

        /* count the argument */
        ++argc;
        
        /* check for another argument */
        if (typ == TOKT_COMMA)
        {
            /* remember the offset of the start of this argument */
            argofs[argc] = tok.get_text() + tok.get_text_len()
                           - srcbuf->get_text();

            /* skip the comma and go back for another argument */
            typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                               TRUE);
        }
        else if (typ == TOKT_RPAR)
        {
            /* 
             *   No need to look any further.  Note that we don't want to
             *   get another token, since we're done parsing the input
             *   now, and we want to leave the token stream positioned for
             *   the caller just after the extent of the macro, which, in
             *   the case of this function-like macro, ends with the
             *   closing paren.  
             */
            break;
        }
    }

    /* if we didn't find the right paren, flag the error */
    if (typ != TOKT_RPAR)
    {
        log_error(read_more
                  ? TCERR_PP_MACRO_ARG_RPAR : TCERR_PP_MACRO_ARG_RPAR_1LINE,
                  (int)entry->getlen(), entry->getstr());
        return 1;
    }

    /* remove leading and trailing whitespace from each argument */
    for (i = 0 ; i < argc ; ++i)
    {
        const char *start;
        const char *end;
        utf8_ptr p;
        size_t del_len;
        int sp_cnt;

        /* figure the limits of the argument text */
        start = srcbuf->get_text() + argofs[i];
        end = start + arglen[i];

        /* remove leading whitespace */
        for (p.set((char *)start) ; p.getptr() < end && is_space(p.getch()) ;
             p.inc()) ;

        /* set the new offset and length */
        del_len = p.getptr() - start;
        argofs[i] += del_len;
        arglen[i] -= del_len;
        start += del_len;

        /* remove trailing whitespace */
        p.set((char *)end);
        sp_cnt = 0;
        while (p.getptr() > start)
        {
            wchar_t ch;

            /* go to the prior character */
            p.dec();

            /* if it's not whitespace, keep it */
            ch = p.getch();
            if (!is_space(ch))
            {
                /* put the character back */
                p.inc();

                /* 
                 *   if this is a backslash, and a space follows, keep the
                 *   immediately following space, since it's part of the
                 *   backslash sequence 
                 */
                if (ch == '\\' && sp_cnt != 0)
                    p.inc();

                /* we're done scanning */
                break;
            }

            /* count another removed trailing space */
            ++sp_cnt;
        }

        /* adjust the length */
        arglen[i] -= (end - p.getptr());
    }

    /* 
     *   if we did any line splicing, cut off the rest of the line and
     *   push it back into the logical input stream as a new line - this
     *   will allow better error message positioning if errors occur in
     *   the remainder of the line, since this means we'll only
     *   artificially join onto one line the part of the new line that
     *   contained the macro parameters 
     */
    if (spliced)
        unsplice_line(tok.get_text() + tok.get_text_len());
    
    /* make sure we found enough arguments */
    if (argc < entry->get_min_argc())
    {
        /* fill in the remaining arguments with empty strings */
        for ( ; argc < entry->get_argc() ; ++argc)
        {
            argofs[argc] = 0;
            arglen[argc] = 0;
        }
        
        /* note the error, but proceed with empty arguments */
        log_warning(TCERR_PP_FEW_MACRO_ARGS,
                    (int)entry->getlen(), entry->getstr());
    }

    /* 
     *   if we have varargs, always supply an empty marker for the last
     *   argument 
     */
    if (entry->has_varargs() && argc < TOK_MAX_MACRO_ARGS)
    {
        argofs[argc] = 0;
        arglen[argc] = 0;
    }

    /* success - we found an actual parameter list */
    *found_actuals = TRUE;
    return 0;
}